

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

vtable_type * Omega_h::any::vtable_for_type<Omega_h::InputMap>(void)

{
  return &vtable_for_type<Omega_h::InputMap>::table;
}

Assistant:

static vtable_type* vtable_for_type() {
    using VTableType = typename std::conditional<requires_allocation<T>::value,
        vtable_dynamic<T>, vtable_stack<T>>::type;
    static vtable_type table = {
        VTableType::type,
        VTableType::destroy,
        VTableType::copy,
        VTableType::move,
        VTableType::swap,
    };
    return &table;
  }